

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

void ON_aStringHeader_DecrementRefCountAndDeleteIfZero(ON_aStringHeader *hdr)

{
  if ((ON_Internal_Empty_aString *)hdr != &empty_astring && hdr != (ON_aStringHeader *)0x0) {
    LOCK();
    (hdr->ref_count).super___atomic_base<int>._M_i =
         (hdr->ref_count).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((hdr->ref_count).super___atomic_base<int>._M_i == 0) {
      hdr->string_length = 0;
      hdr->string_capacity = 0;
      onfree(hdr);
      return;
    }
  }
  return;
}

Assistant:

static void ON_aStringHeader_DecrementRefCountAndDeleteIfZero(class ON_aStringHeader* hdr)
{
  if (nullptr == hdr || hdr == pEmptyStringHeader)
    return;
  //const int ref_count = ON_AtomicDecrementInt32(&hdr->ref_count);
  const int ref_count = --hdr->ref_count;
  if (0 == ref_count)
  {
    // zero entire header to help prevent crashes from corrupt string bug
    hdr->string_length = 0;
    hdr->string_capacity = 0;
    onfree(hdr);
  }
}